

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

ExtractResult
absl::lts_20250127::cord_internal::CordRepBtree::ExtractAppendBuffer
          (CordRepBtree *tree,size_t extra_capacity)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  size_t sVar4;
  CordRepBtree *pCVar5;
  CordRep *pCVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ExtractResult EVar10;
  NodeStack stack;
  undefined8 auStack_a0 [14];
  
  pCVar6 = (CordRep *)0x0;
  lVar9 = 0;
  for (pCVar5 = tree; iVar3 = (pCVar5->super_CordRep).refcount.count_.super___atomic_base<int>._M_i,
      (pCVar5->super_CordRep).storage[0] != '\0';
      pCVar5 = CordRep::btree(*(CordRep **)
                               ((pCVar5->super_CordRep).storage +
                               (ulong)(pCVar5->super_CordRep).storage[2] * 8 + -5))) {
    if (iVar3 != 2) goto LAB_00272b91;
    auStack_a0[lVar9 + 1] = pCVar5;
    lVar9 = lVar9 + 1;
    auStack_a0[0] = 0x272b52;
  }
  if (((iVar3 == 2) &&
      (pCVar6 = *(CordRep **)
                 ((pCVar5->super_CordRep).storage +
                 (ulong)(pCVar5->super_CordRep).storage[2] * 8 + -5), 5 < pCVar6->tag)) &&
     ((pCVar6->refcount).count_.super___atomic_base<int>._M_i == 2)) {
    auStack_a0[0] = 0x272b79;
    pCVar6 = &CordRep::flat(pCVar6)->super_CordRep;
    sVar4 = ((CordRep *)&pCVar6->length)->length;
    auStack_a0[0] = 0x272b87;
    sVar7 = CordRepFlat::Capacity((CordRepFlat *)pCVar6);
    if (extra_capacity <= sVar7 - ((CordRep *)&pCVar6->length)->length) {
      tree = pCVar5;
      while (bVar1 = (tree->super_CordRep).storage[2],
            (ulong)bVar1 - (ulong)(tree->super_CordRep).storage[1] == 1) {
        auStack_a0[0] = 0x272bc7;
        Delete(tree);
        tree = (CordRepBtree *)0x0;
        if (lVar9 < 1) goto LAB_00272b91;
        tree = (CordRepBtree *)auStack_a0[lVar9];
        lVar9 = lVar9 + -1;
      }
      (tree->super_CordRep).storage[2] = bVar1 - 1;
      for (; (tree->super_CordRep).length = (tree->super_CordRep).length - sVar4, 0 < lVar9;
          lVar9 = lVar9 + -1) {
        tree = (CordRepBtree *)auStack_a0[lVar9];
      }
      while (uVar8 = (ulong)(tree->super_CordRep).storage[2],
            uVar8 - (tree->super_CordRep).storage[1] == 1) {
        pCVar5 = *(CordRepBtree **)((tree->super_CordRep).storage + uVar8 * 8 + -5);
        uVar2 = (tree->super_CordRep).storage[0];
        auStack_a0[0] = 0x272bff;
        Delete(tree);
        tree = pCVar5;
        if (uVar2 == '\0') break;
        auStack_a0[0] = 0x272c0c;
        tree = CordRep::btree(&pCVar5->super_CordRep);
      }
      goto LAB_00272b91;
    }
  }
  pCVar6 = (CordRep *)0x0;
LAB_00272b91:
  EVar10.extracted = pCVar6;
  EVar10.tree = &tree->super_CordRep;
  return EVar10;
}

Assistant:

CordRepBtree::ExtractResult CordRepBtree::ExtractAppendBuffer(
    CordRepBtree* tree, size_t extra_capacity) {
  int depth = 0;
  NodeStack stack;

  // Set up default 'no success' result which is {tree, nullptr}.
  ExtractResult result;
  result.tree = tree;
  result.extracted = nullptr;

  // Dive down the right side of the tree, making sure no edges are shared.
  while (tree->height() > 0) {
    if (!tree->refcount.IsOne()) return result;
    stack[depth++] = tree;
    tree = tree->Edge(kBack)->btree();
  }
  if (!tree->refcount.IsOne()) return result;

  // Validate we ended on a non shared flat.
  CordRep* rep = tree->Edge(kBack);
  if (!(rep->IsFlat() && rep->refcount.IsOne())) return result;

  // Verify it has at least the requested extra capacity.
  CordRepFlat* flat = rep->flat();
  const size_t length = flat->length;
  const size_t avail = flat->Capacity() - flat->length;
  if (extra_capacity > avail) return result;

  // Set the extracted flat in the result.
  result.extracted = flat;

  // Cascading delete all nodes that become empty.
  while (tree->size() == 1) {
    CordRepBtree::Delete(tree);
    if (--depth < 0) {
      // We consumed the entire tree: return nullptr for new tree.
      result.tree = nullptr;
      return result;
    }
    rep = tree;
    tree = stack[depth];
  }

  // Remove the edge or cascaded up parent node.
  tree->set_end(tree->end() - 1);
  tree->length -= length;

  // Adjust lengths up the tree.
  while (depth > 0) {
    tree = stack[--depth];
    tree->length -= length;
  }

  // Remove unnecessary top nodes with size = 1. This may iterate all the way
  // down to the leaf node in which case we simply return the remaining last
  // edge in that node and the extracted flat.
  while (tree->size() == 1) {
    int height = tree->height();
    rep = tree->Edge(kBack);
    Delete(tree);
    if (height == 0) {
      // We consumed the leaf: return the sole data edge as the new tree.
      result.tree = rep;
      return result;
    }
    tree = rep->btree();
  }

  // Done: return the (new) top level node and extracted flat.
  result.tree = tree;
  return result;
}